

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-cda-dump.cpp
# Opt level: O0

raw_ostream * getInstName_abi_cxx11_(Value *val)

{
  bool bVar1;
  pointer ppVar2;
  raw_ostream *in_RDI;
  CVariableDecl *decl;
  iterator Vit;
  DebugLoc *DL;
  Instruction *I;
  raw_os_ostream ro;
  ostringstream ostr;
  undefined4 in_stack_fffffffffffffdc8;
  uint in_stack_fffffffffffffdcc;
  raw_ostream *in_stack_fffffffffffffdd0;
  raw_ostream *this;
  StringRef local_218;
  undefined4 local_204;
  CVariableDecl *local_200;
  _Self local_1f8;
  ret_type local_1f0;
  _Self local_1e8;
  DebugLoc *local_1e0;
  ret_type local_1d8;
  raw_os_ostream local_1d0 [72];
  ostringstream local_188 [392];
  
  this = in_RDI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  llvm::raw_os_ostream::raw_os_ostream
            ((raw_os_ostream *)in_stack_fffffffffffffdd0,
             (ostream *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  bVar1 = llvm::cl::opt_storage::operator_cast_to_bool((opt_storage<bool,_false,_false> *)0x15a966);
  if (bVar1) {
    local_1d8 = llvm::dyn_cast<llvm::Instruction,llvm::Value_const>
                          ((Value *)in_stack_fffffffffffffdd0);
    if (local_1d8 == (ret_type)0x0) {
      llvm::raw_ostream::operator<<(this,(char *)in_RDI);
      llvm::operator<<(in_stack_fffffffffffffdd0,
                       (Value *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    }
    else {
      local_1e0 = llvm::Instruction::getDebugLoc(local_1d8);
      bVar1 = llvm::DebugLoc::operator_cast_to_bool((DebugLoc *)0x15a9a6);
      if (bVar1) {
        llvm::DebugLoc::getLine();
        llvm::raw_ostream::operator<<(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
        in_stack_fffffffffffffdd0 = llvm::raw_ostream::operator<<(this,(char *)in_RDI);
        llvm::DebugLoc::getCol();
        llvm::raw_ostream::operator<<(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
      }
      else {
        local_1f0 = local_1d8;
        local_1e8._M_node =
             (_Base_ptr)
             std::
             map<const_llvm::Value_*,_CVariableDecl,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_CVariableDecl>_>_>
             ::find((map<const_llvm::Value_*,_CVariableDecl,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_CVariableDecl>_>_>
                     *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                    (key_type *)0x15aa0c);
        local_1f8._M_node =
             (_Base_ptr)
             std::
             map<const_llvm::Value_*,_CVariableDecl,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_CVariableDecl>_>_>
             ::end((map<const_llvm::Value_*,_CVariableDecl,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_CVariableDecl>_>_>
                    *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        bVar1 = std::operator!=(&local_1e8,&local_1f8);
        if (bVar1) {
          ppVar2 = std::_Rb_tree_iterator<std::pair<const_llvm::Value_*const,_CVariableDecl>_>::
                   operator->((_Rb_tree_iterator<std::pair<const_llvm::Value_*const,_CVariableDecl>_>
                               *)0x15aa41);
          local_200 = &ppVar2->second;
          llvm::raw_ostream::operator<<(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
          llvm::raw_ostream::operator<<(this,(char *)in_RDI);
          llvm::raw_ostream::operator<<(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
        }
        else {
          llvm::raw_ostream::operator<<(this,(char *)in_RDI);
          llvm::operator<<(in_stack_fffffffffffffdd0,
                           (Value *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        }
      }
    }
    llvm::raw_ostream::flush(in_stack_fffffffffffffdd0);
    std::__cxx11::ostringstream::str();
  }
  else {
    bVar1 = llvm::isa<llvm::Function,llvm::Value_const*>((Value **)0x15aafa);
    if (bVar1) {
      local_218 = (StringRef)llvm::Value::getName();
      llvm::StringRef::data(&local_218);
      llvm::raw_ostream::operator<<(this,(char *)in_RDI);
    }
    else {
      llvm::operator<<(in_stack_fffffffffffffdd0,
                       (Value *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    }
    llvm::raw_ostream::flush(in_stack_fffffffffffffdd0);
    std::__cxx11::ostringstream::str();
  }
  local_204 = 1;
  llvm::raw_os_ostream::~raw_os_ostream(local_1d0);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return this;
}

Assistant:

static std::string getInstName(const llvm::Value *val) {
    assert(val);
    std::ostringstream ostr;
    llvm::raw_os_ostream ro(ostr);

    if (dump_c_lines) {
        if (const auto *I = llvm::dyn_cast<llvm::Instruction>(val)) {
            const auto &DL = I->getDebugLoc();
            if (DL) {
                ro << DL.getLine() << ":" << DL.getCol();
            } else {
                auto Vit = valuesToVars.find(I);
                if (Vit != valuesToVars.end()) {
                    auto &decl = Vit->second;
                    ro << decl.line << ":" << decl.col;
                } else {
                    ro << "(no dbg) ";
                    ro << *val;
                }
            }
        } else {
            ro << "(no inst) ";
            ro << *val;
        }
        ro.flush();
        return ostr.str();
    }

    if (llvm::isa<llvm::Function>(val))
        ro << val->getName().data();
    else
        ro << *val;

    ro.flush();

    // break the string if it is too long
    return ostr.str();
}